

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestUnpackedTypes::_InternalSerialize
          (TestUnpackedTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_int> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  float fVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  unsigned_long uVar10;
  int iVar11;
  uint uVar12;
  const_reference piVar13;
  ulong uVar14;
  ulong *puVar15;
  const_reference puVar16;
  const_reference puVar17;
  const_reference plVar18;
  const_reference pfVar19;
  const_reference pdVar20;
  const_reference pbVar21;
  uint8_t *puVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  byte *pbVar26;
  
  iVar11 = google::protobuf::internal::SooRep::size
                     ((SooRep *)&(this->field_0)._impl_,
                      (undefined1  [232])((undefined1  [232])this->field_0 & (undefined1  [232])0x4)
                      == (undefined1  [232])0x0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar13 = google::protobuf::RepeatedField<int>::Get
                          (&(this->field_0)._impl_.unpacked_int32_,iVar25);
      uVar14 = (ulong)*piVar13;
      pbVar26 = target + 2;
      target[0] = 0xd0;
      target[1] = 5;
      uVar24 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar26 = (byte)uVar24 | 0x80;
          uVar14 = uVar24 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar24;
          uVar24 = uVar14;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar14;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar1 = &(this->field_0)._impl_.unpacked_int64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,
                      (undefined1  [232])((undefined1  [232])this->field_0 & (undefined1  [232])0x4)
                      == (undefined1  [232])0x0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar15 = (ulong *)google::protobuf::RepeatedField<long>::Get(pRVar1,iVar25);
      uVar24 = *puVar15;
      target[0] = 0xd8;
      target[1] = 5;
      pbVar26 = target + 2;
      uVar14 = uVar24;
      if (0x7f < uVar24) {
        do {
          *pbVar26 = (byte)uVar14 | 0x80;
          uVar24 = uVar14 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar14;
          uVar14 = uVar24;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar24;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar2 = &(this->field_0)._impl_.unpacked_uint32_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar16 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar2,iVar25);
      uVar23 = *puVar16;
      target[0] = 0xe0;
      target[1] = 5;
      pbVar26 = target + 2;
      uVar12 = uVar23;
      if (0x7f < uVar23) {
        do {
          *pbVar26 = (byte)uVar12 | 0x80;
          uVar23 = uVar12 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar12;
          uVar12 = uVar23;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar23;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar3 = &(this->field_0)._impl_.unpacked_uint64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x30) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar17 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar3,iVar25);
      uVar24 = *puVar17;
      target[0] = 0xe8;
      target[1] = 5;
      pbVar26 = target + 2;
      uVar14 = uVar24;
      if (0x7f < uVar24) {
        do {
          *pbVar26 = (byte)uVar14 | 0x80;
          uVar24 = uVar14 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar14;
          uVar14 = uVar24;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar24;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar4 = &(this->field_0)._impl_.unpacked_sint32_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x40) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar13 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar25);
      iVar8 = *piVar13;
      target[0] = 0xf0;
      target[1] = 5;
      pbVar26 = target + 2;
      uVar12 = iVar8 >> 0x1f ^ iVar8 * 2;
      uVar23 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar26 = (byte)uVar23 | 0x80;
          uVar12 = uVar23 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar23;
          uVar23 = uVar12;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar12;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar1 = &(this->field_0)._impl_.unpacked_sint64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x50) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      plVar18 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar25);
      lVar9 = *plVar18;
      target[0] = 0xf8;
      target[1] = 5;
      pbVar26 = target + 2;
      uVar14 = lVar9 >> 0x3f ^ lVar9 * 2;
      uVar24 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar26 = (byte)uVar24 | 0x80;
          uVar14 = uVar24 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar24;
          uVar24 = uVar14;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar14;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar2 = &(this->field_0)._impl_.unpacked_fixed32_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x60) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar16 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar2,iVar25);
      uVar23 = *puVar16;
      target[0] = 0x85;
      target[1] = 6;
      *(uint *)(target + 2) = uVar23;
      target = target + 6;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  pRVar3 = &(this->field_0)._impl_.unpacked_fixed64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x70) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar17 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar3,iVar25);
      uVar10 = *puVar17;
      target[0] = 0x89;
      target[1] = 6;
      *(unsigned_long *)(target + 2) = uVar10;
      target = target + 10;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  pRVar4 = &(this->field_0)._impl_.unpacked_sfixed32_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x80) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar13 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar25);
      iVar8 = *piVar13;
      target[0] = 0x95;
      target[1] = 6;
      *(int *)(target + 2) = iVar8;
      target = target + 6;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  pRVar1 = &(this->field_0)._impl_.unpacked_sfixed64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      plVar18 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar25);
      lVar9 = *plVar18;
      target[0] = 0x99;
      target[1] = 6;
      *(long *)(target + 2) = lVar9;
      target = target + 10;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  this_00 = &(this->field_0)._impl_.unpacked_float_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pfVar19 = google::protobuf::RepeatedField<float>::Get(this_00,iVar25);
      fVar5 = *pfVar19;
      target[0] = 0xa5;
      target[1] = 6;
      *(float *)(target + 2) = fVar5;
      target = target + 6;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  this_01 = &(this->field_0)._impl_.unpacked_double_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&this_01->soo_rep_,(*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pdVar20 = google::protobuf::RepeatedField<double>::Get(this_01,iVar25);
      dVar6 = *pdVar20;
      target[0] = 0xa9;
      target[1] = 6;
      *(double *)(target + 2) = dVar6;
      target = target + 10;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  this_02 = &(this->field_0)._impl_.unpacked_bool_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&this_02->soo_rep_,(*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pbVar21 = google::protobuf::RepeatedField<bool>::Get(this_02,iVar25);
      bVar7 = *pbVar21;
      target[0] = 0xb0;
      target[1] = 6;
      target[2] = bVar7;
      target = target + 3;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  pRVar4 = &(this->field_0)._impl_.unpacked_enum_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0xd0) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar13 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar25);
      uVar14 = (ulong)*piVar13;
      pbVar26 = target + 2;
      target[0] = 0xb8;
      target[1] = 6;
      uVar24 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar26 = (byte)uVar24 | 0x80;
          uVar14 = uVar24 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar24;
          uVar24 = uVar14;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar14;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  uVar24 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar24 & 1) != 0) {
    puVar22 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)((uVar24 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar22;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestUnpackedTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestUnpackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestUnpackedTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 unpacked_int32 = 90 [features = {
  for (int i = 0, n = this_._internal_unpacked_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        90, this_._internal_unpacked_int32().Get(i), target);
  }

  // repeated int64 unpacked_int64 = 91 [features = {
  for (int i = 0, n = this_._internal_unpacked_int64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt64ToArray(
        91, this_._internal_unpacked_int64().Get(i), target);
  }

  // repeated uint32 unpacked_uint32 = 92 [features = {
  for (int i = 0, n = this_._internal_unpacked_uint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        92, this_._internal_unpacked_uint32().Get(i), target);
  }

  // repeated uint64 unpacked_uint64 = 93 [features = {
  for (int i = 0, n = this_._internal_unpacked_uint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        93, this_._internal_unpacked_uint64().Get(i), target);
  }

  // repeated sint32 unpacked_sint32 = 94 [features = {
  for (int i = 0, n = this_._internal_unpacked_sint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt32ToArray(
        94, this_._internal_unpacked_sint32().Get(i), target);
  }

  // repeated sint64 unpacked_sint64 = 95 [features = {
  for (int i = 0, n = this_._internal_unpacked_sint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt64ToArray(
        95, this_._internal_unpacked_sint64().Get(i), target);
  }

  // repeated fixed32 unpacked_fixed32 = 96 [features = {
  for (int i = 0, n = this_._internal_unpacked_fixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        96, this_._internal_unpacked_fixed32().Get(i), target);
  }

  // repeated fixed64 unpacked_fixed64 = 97 [features = {
  for (int i = 0, n = this_._internal_unpacked_fixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed64ToArray(
        97, this_._internal_unpacked_fixed64().Get(i), target);
  }

  // repeated sfixed32 unpacked_sfixed32 = 98 [features = {
  for (int i = 0, n = this_._internal_unpacked_sfixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed32ToArray(
        98, this_._internal_unpacked_sfixed32().Get(i), target);
  }

  // repeated sfixed64 unpacked_sfixed64 = 99 [features = {
  for (int i = 0, n = this_._internal_unpacked_sfixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed64ToArray(
        99, this_._internal_unpacked_sfixed64().Get(i), target);
  }

  // repeated float unpacked_float = 100 [features = {
  for (int i = 0, n = this_._internal_unpacked_float_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        100, this_._internal_unpacked_float().Get(i), target);
  }

  // repeated double unpacked_double = 101 [features = {
  for (int i = 0, n = this_._internal_unpacked_double_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        101, this_._internal_unpacked_double().Get(i), target);
  }

  // repeated bool unpacked_bool = 102 [features = {
  for (int i = 0, n = this_._internal_unpacked_bool_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        102, this_._internal_unpacked_bool().Get(i), target);
  }

  // repeated .edition_unittest.ForeignEnum unpacked_enum = 103 [features = {
  for (int i = 0, n = this_._internal_unpacked_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        103, static_cast<::edition_unittest::ForeignEnum>(this_._internal_unpacked_enum().Get(i)),
        target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestUnpackedTypes)
  return target;
}